

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# free.c
# Opt level: O0

size_t mi_page_usable_aligned_size_of(mi_page_t *page,void *p)

{
  mi_block_t *pmVar1;
  size_t sVar2;
  long in_RSI;
  size_t aligned_size;
  ptrdiff_t adjust;
  size_t size;
  mi_block_t *block;
  mi_block_t *in_stack_ffffffffffffffc8;
  mi_page_t *in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  mi_page_t *in_stack_ffffffffffffffe0;
  
  pmVar1 = _mi_page_ptr_unalign(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  sVar2 = mi_page_usable_size_of(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return sVar2 - (in_RSI - (long)pmVar1);
}

Assistant:

static size_t mi_decl_noinline mi_page_usable_aligned_size_of(const mi_page_t* page, const void* p) mi_attr_noexcept {
  const mi_block_t* block = _mi_page_ptr_unalign(page, p);
  const size_t size = mi_page_usable_size_of(page, block);
  const ptrdiff_t adjust = (uint8_t*)p - (uint8_t*)block;
  mi_assert_internal(adjust >= 0 && (size_t)adjust <= size);
  const size_t aligned_size = (size - adjust);
  #if MI_GUARDED
  if (mi_block_ptr_is_guarded(block, p)) {
    return aligned_size - _mi_os_page_size();
  }
  #endif
  return aligned_size;
}